

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O3

void __thiscall Gc_StartAndKill_Test::TestBody(Gc_StartAndKill_Test *this)

{
  int in_EDX;
  char *pcVar1;
  thread thread;
  spawn_params call0;
  test_watch_thread gc;
  AssertHelper local_1b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  long local_188;
  spawn_params local_180;
  test_watch_thread local_158;
  
  (anonymous_namespace)::Gc::call_params_abi_cxx11_(&local_180,(Gc *)0x0,in_EDX);
  anon_unknown.dwarf_5c2dc::test_watch_thread::test_watch_thread(&local_158);
  anon_unknown.dwarf_5c2dc::Gc::expect_call
            (&local_158,
             &local_180.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl,
             (process_identifier)
             local_180.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_188 = 0;
  local_1a8 = (undefined1  [8])operator_new(0x10);
  *(undefined ***)local_1a8 = &PTR___State_00196198;
  *(test_watch_thread **)((long)local_1a8 + 8) = &local_158;
  std::thread::_M_start_thread(&local_188,local_1a8,0);
  if (local_1a8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_1a8 + 8))();
  }
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"path0","");
  pstore::broker::gc_watch_thread::start_vacuum
            (&local_158.super_gc_watch_thread,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
  }
  local_1b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       pstore::broker::gc_watch_thread::size(&local_158.super_gc_watch_thread);
  local_1b8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1a8,"gc.size ()","1U",(unsigned_long *)&local_1b0,(uint *)&local_1b8)
  ;
  if (local_1a8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_1a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
               ,0xe6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a0,local_1a0);
  }
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"path0","");
  pstore::broker::gc_watch_thread::stop_vacuum(&local_158.super_gc_watch_thread,(string *)local_1a8)
  ;
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
  }
  local_1b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       pstore::broker::gc_watch_thread::size(&local_158.super_gc_watch_thread);
  local_1b8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1a8,"gc.size ()","0U",(unsigned_long *)&local_1b0,(uint *)&local_1b8)
  ;
  if (local_1a8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_1a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
               ,0xe8,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a0,local_1a0);
  }
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"path0","");
  pstore::broker::gc_watch_thread::stop_vacuum(&local_158.super_gc_watch_thread,(string *)local_1a8)
  ;
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
  }
  local_1b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       pstore::broker::gc_watch_thread::size(&local_158.super_gc_watch_thread);
  local_1b8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1a8,"gc.size ()","0U",(unsigned_long *)&local_1b0,(uint *)&local_1b8)
  ;
  if (local_1a8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_1a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
               ,0xea,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a0,local_1a0);
  }
  pstore::broker::gc_watch_thread::stop(&local_158.super_gc_watch_thread,-1);
  std::thread::join();
  if (local_188 == 0) {
    local_158.super_gc_watch_thread._vptr_gc_watch_thread =
         (_func_int **)&PTR__test_watch_thread_00196010;
    testing::internal::FunctionMocker<void_(const_int_&)>::~FunctionMocker
              (&local_158.gmock01_kill_50);
    testing::internal::FunctionMocker<int_(std::initializer_list<const_char_*>)>::~FunctionMocker
              (&local_158.gmock01_spawn_49);
    pstore::broker::gc_watch_thread::~gc_watch_thread(&local_158.super_gc_watch_thread);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p !=
        &local_180.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl.field_2) {
      operator_delete(local_180.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_180.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::terminate();
}

Assistant:

TEST_F (Gc, StartAndKill) {
    constexpr auto path = "path0";
    auto call0 = call_params (0);

    test_watch_thread gc;
    expect_call (gc, call0);

    std::thread thread{[&gc] () { gc.watcher (); }};
    gc.start_vacuum (path);
    EXPECT_EQ (gc.size (), 1U);
    gc.stop_vacuum (path);
    EXPECT_EQ (gc.size (), 0U);
    gc.stop_vacuum (path);
    EXPECT_EQ (gc.size (), 0U);
    gc.stop ();
    thread.join ();
}